

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayDisposer::dispose<kj::_::RaceSuccessfulPromiseNodeBase::Branch>
          (ArrayDisposer *this,Branch *firstElement,size_t elementCount,size_t capacity)

{
  size_t capacity_local;
  size_t elementCount_local;
  Branch *firstElement_local;
  ArrayDisposer *this_local;
  
  (*(code *)**(undefined8 **)this)
            (this,firstElement,0x50,elementCount,capacity,
             Dispose_<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::destruct);
  return;
}

Assistant:

void ArrayDisposer::dispose(T* firstElement, size_t elementCount, size_t capacity) const {
  if constexpr (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
    disposeImpl(const_cast<RemoveConst<T>*>(firstElement),
                         sizeof(T), elementCount, capacity, nullptr);
  } else {
    disposeImpl(const_cast<RemoveConst<T>*>(firstElement),
                         sizeof(T), elementCount, capacity, &Dispose_<T>::destruct);
  }
}